

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontSpecsOf.hpp
# Opt level: O1

void __thiscall sciplot::FontSpecs::~FontSpecs(FontSpecs *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)&this->super_FontSpecsOf<sciplot::FontSpecs> = &PTR__FontSpecsOf_001a8a68;
  pcVar2 = (this->super_FontSpecsOf<sciplot::FontSpecs>).m_fontsize._M_dataplus._M_p;
  paVar1 = &(this->super_FontSpecsOf<sciplot::FontSpecs>).m_fontsize.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_FontSpecsOf<sciplot::FontSpecs>).m_fontname._M_dataplus._M_p;
  paVar1 = &(this->super_FontSpecsOf<sciplot::FontSpecs>).m_fontname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

FontSpecsOf<DerivedSpecs>::FontSpecsOf()
{}